

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

void jpeg_stdio_dest(j_compress_ptr cinfo,FILE *outfile)

{
  long lVar1;
  undefined8 in_RSI;
  long *in_RDI;
  my_dest_ptr dest;
  
  if (in_RDI[5] == 0) {
    lVar1 = (**(code **)in_RDI[1])(in_RDI,0,0x38);
    in_RDI[5] = lVar1;
  }
  else if (*(code **)(in_RDI[5] + 0x10) != init_destination) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x17;
    (**(code **)*in_RDI)(in_RDI);
  }
  lVar1 = in_RDI[5];
  *(code **)(lVar1 + 0x10) = init_destination;
  *(code **)(lVar1 + 0x18) = empty_output_buffer;
  *(code **)(lVar1 + 0x20) = term_destination;
  *(undefined8 *)(lVar1 + 0x28) = in_RSI;
  return;
}

Assistant:

GLOBAL(void)
jpeg_stdio_dest(j_compress_ptr cinfo, FILE *outfile)
{
  my_dest_ptr dest;

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same file without re-executing jpeg_stdio_dest.
   */
  if (cinfo->dest == NULL) {    /* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(my_destination_mgr));
  } else if (cinfo->dest->init_destination != init_destination) {
    /* It is unsafe to reuse the existing destination manager unless it was
     * created by this function.  Otherwise, there is no guarantee that the
     * opaque structure is the right size.  Note that we could just create a
     * new structure, but the old structure would not be freed until
     * jpeg_destroy_compress() was called.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  dest = (my_dest_ptr)cinfo->dest;
  dest->pub.init_destination = init_destination;
  dest->pub.empty_output_buffer = empty_output_buffer;
  dest->pub.term_destination = term_destination;
  dest->outfile = outfile;
}